

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::TimeUtilTest_DurationIntegerConversion_Test::TestBody
          (TimeUtilTest_DurationIntegerConversion_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Duration *duration;
  Duration *duration_00;
  Duration *duration_01;
  Duration *duration_02;
  Duration *duration_03;
  Duration *duration_04;
  Duration *duration_05;
  Duration *duration_06;
  Duration *duration_07;
  Duration *duration_08;
  Duration *duration_09;
  Duration *duration_10;
  AssertHelper local_a80;
  Message local_a78;
  Duration local_a70;
  int64_t local_a48;
  int local_a3c;
  undefined1 local_a38 [8];
  AssertionResult gtest_ar_27;
  Message local_a20;
  Duration local_a18;
  int64_t local_9f0;
  int local_9e4;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar_26;
  Message local_9c8;
  Duration local_9c0;
  int64_t local_998;
  int local_98c;
  undefined1 local_988 [8];
  AssertionResult gtest_ar_25;
  Message local_970;
  Duration local_968;
  int64_t local_940;
  int local_934;
  undefined1 local_930 [8];
  AssertionResult gtest_ar_24;
  Message local_918;
  Duration local_910;
  int64_t local_8e8;
  int local_8dc;
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar_23;
  Message local_8c0;
  Duration local_8b8;
  int64_t local_890;
  int local_884;
  undefined1 local_880 [8];
  AssertionResult gtest_ar_22;
  Message local_868;
  Duration local_860;
  int64_t local_838;
  int local_82c;
  undefined1 local_828 [8];
  AssertionResult gtest_ar_21;
  Message local_810;
  Duration local_808;
  int64_t local_7e0;
  int local_7d4;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_20;
  Message local_7b8;
  Duration local_7b0;
  int64_t local_788;
  long local_780;
  undefined1 local_778 [8];
  AssertionResult gtest_ar_19;
  Message local_760;
  Duration local_758;
  int64_t local_730;
  long local_728;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_18;
  Message local_708;
  Duration local_700;
  int64_t local_6d8;
  int local_6cc;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar_17;
  Message local_6b0;
  Duration local_6a8;
  int64_t local_680;
  int local_674;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_16;
  Message local_658;
  Duration local_650;
  int64_t local_628;
  int local_61c;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_15;
  Message local_600;
  Duration local_5f8;
  int64_t local_5d0;
  int local_5c4;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_14;
  Message local_5a8;
  Duration local_5a0;
  int64_t local_578;
  int local_56c;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_13;
  Message local_550;
  Duration local_548;
  int64_t local_520;
  int local_514;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_12;
  Message local_4f8;
  Duration local_4f0;
  string local_4c8;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_11;
  Message local_490;
  Duration local_488;
  string local_460;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_10;
  Message local_428;
  Duration local_420;
  string local_3f8;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_9;
  Message local_3c0;
  Duration local_3b8;
  string local_390;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_8;
  Message local_358;
  Duration local_350;
  string local_328;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_7;
  Message local_2f0;
  Duration local_2e8;
  string local_2c0;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_6;
  Message local_288;
  Duration local_280;
  string local_258;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_5;
  Message local_220;
  Duration local_218;
  string local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_4;
  Message local_1b8;
  Duration local_1b0;
  string local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  Message local_150;
  Duration local_148;
  string local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  Duration local_e0;
  string local_b8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  Duration local_68;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  TimeUtilTest_DurationIntegerConversion_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  TimeUtil::NanosecondsToDuration(&local_68,1);
  TimeUtil::ToString_abi_cxx11_(&local_40,(TimeUtil *)&local_68,duration);
  testing::internal::EqHelper::
  Compare<char[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_20,"\"0.000000001s\"",
             "TimeUtil::ToString(TimeUtil::NanosecondsToDuration(1))",(char (*) [13])0x1ed070a,
             &local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Duration::~Duration(&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x78,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  TimeUtil::NanosecondsToDuration(&local_e0,-1);
  TimeUtil::ToString_abi_cxx11_(&local_b8,(TimeUtil *)&local_e0,duration_00);
  testing::internal::EqHelper::
  Compare<char[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_98,"\"-0.000000001s\"",
             "TimeUtil::ToString(TimeUtil::NanosecondsToDuration(-1))",
             (char (*) [14])"-0.000000001s",&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  Duration::~Duration(&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  TimeUtil::MicrosecondsToDuration(&local_148,1);
  TimeUtil::ToString_abi_cxx11_(&local_120,(TimeUtil *)&local_148,duration_01);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_100,"\"0.000001s\"",
             "TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(1))",(char (*) [10])0x1ed07a2,
             &local_120);
  std::__cxx11::string::~string((string *)&local_120);
  Duration::~Duration(&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  TimeUtil::MicrosecondsToDuration(&local_1b0,-1);
  TimeUtil::ToString_abi_cxx11_(&local_188,(TimeUtil *)&local_1b0,duration_02);
  testing::internal::EqHelper::
  Compare<char[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_168,"\"-0.000001s\"",
             "TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(-1))",(char (*) [11])"-0.000001s",
             &local_188);
  std::__cxx11::string::~string((string *)&local_188);
  Duration::~Duration(&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  TimeUtil::MillisecondsToDuration(&local_218,1);
  TimeUtil::ToString_abi_cxx11_(&local_1f0,(TimeUtil *)&local_218,duration_03);
  testing::internal::EqHelper::
  Compare<char[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1d0,"\"0.001s\"",
             "TimeUtil::ToString(TimeUtil::MillisecondsToDuration(1))",(char (*) [7])0x1ed0831,
             &local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  Duration::~Duration(&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  TimeUtil::MillisecondsToDuration(&local_280,-1);
  TimeUtil::ToString_abi_cxx11_(&local_258,(TimeUtil *)&local_280,duration_04);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_238,"\"-0.001s\"",
             "TimeUtil::ToString(TimeUtil::MillisecondsToDuration(-1))",(char (*) [8])"-0.001s",
             &local_258);
  std::__cxx11::string::~string((string *)&local_258);
  Duration::~Duration(&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  TimeUtil::SecondsToDuration(&local_2e8,1);
  TimeUtil::ToString_abi_cxx11_(&local_2c0,(TimeUtil *)&local_2e8,duration_05);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_2a0,"\"1s\"","TimeUtil::ToString(TimeUtil::SecondsToDuration(1))",
             (char (*) [3])0x1ed0873,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  Duration::~Duration(&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  TimeUtil::SecondsToDuration(&local_350,-1);
  TimeUtil::ToString_abi_cxx11_(&local_328,(TimeUtil *)&local_350,duration_06);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_308,"\"-1s\"","TimeUtil::ToString(TimeUtil::SecondsToDuration(-1))",
             (char (*) [4])"-1s",&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  Duration::~Duration(&local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  TimeUtil::MinutesToDuration(&local_3b8,1);
  TimeUtil::ToString_abi_cxx11_(&local_390,(TimeUtil *)&local_3b8,duration_07);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_370,"\"60s\"","TimeUtil::ToString(TimeUtil::MinutesToDuration(1))",
             (char (*) [4])0x1ed08eb,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  Duration::~Duration(&local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  TimeUtil::MinutesToDuration(&local_420,-1);
  TimeUtil::ToString_abi_cxx11_(&local_3f8,(TimeUtil *)&local_420,duration_08);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_3d8,"\"-60s\"","TimeUtil::ToString(TimeUtil::MinutesToDuration(-1))",
             (char (*) [5])"-60s",&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  Duration::~Duration(&local_420);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  TimeUtil::HoursToDuration(&local_488,1);
  TimeUtil::ToString_abi_cxx11_(&local_460,(TimeUtil *)&local_488,duration_09);
  testing::internal::EqHelper::
  Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_440,"\"3600s\"","TimeUtil::ToString(TimeUtil::HoursToDuration(1))",
             (char (*) [6])0x1ed0964,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  Duration::~Duration(&local_488);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  TimeUtil::HoursToDuration(&local_4f0,-1);
  TimeUtil::ToString_abi_cxx11_(&local_4c8,(TimeUtil *)&local_4f0,duration_10);
  testing::internal::EqHelper::
  Compare<char[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_4a8,"\"-3600s\"","TimeUtil::ToString(TimeUtil::HoursToDuration(-1))",
             (char (*) [7])"-3600s",&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  Duration::~Duration(&local_4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  local_514 = 1;
  TimeUtil::NanosecondsToDuration(&local_548,1);
  local_520 = TimeUtil::DurationToNanoseconds(&local_548);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_510,"1",
             "TimeUtil::DurationToNanoseconds(TimeUtil::NanosecondsToDuration(1))",&local_514,
             &local_520);
  Duration::~Duration(&local_548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_550);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  local_56c = -1;
  TimeUtil::NanosecondsToDuration(&local_5a0,-1);
  local_578 = TimeUtil::DurationToNanoseconds(&local_5a0);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_568,"-1",
             "TimeUtil::DurationToNanoseconds(TimeUtil::NanosecondsToDuration(-1))",&local_56c,
             &local_578);
  Duration::~Duration(&local_5a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_5a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_5a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  local_5c4 = 1;
  TimeUtil::MicrosecondsToDuration(&local_5f8,1);
  local_5d0 = TimeUtil::DurationToMicroseconds(&local_5f8);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_5c0,"1",
             "TimeUtil::DurationToMicroseconds(TimeUtil::MicrosecondsToDuration(1))",&local_5c4,
             &local_5d0);
  Duration::~Duration(&local_5f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar1) {
    testing::Message::Message(&local_600);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_600);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  local_61c = -1;
  TimeUtil::MicrosecondsToDuration(&local_650,-1);
  local_628 = TimeUtil::DurationToMicroseconds(&local_650);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_618,"-1",
             "TimeUtil::DurationToMicroseconds( TimeUtil::MicrosecondsToDuration(-1))",&local_61c,
             &local_628);
  Duration::~Duration(&local_650);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  local_674 = 1;
  TimeUtil::MillisecondsToDuration(&local_6a8,1);
  local_680 = TimeUtil::DurationToMilliseconds(&local_6a8);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_670,"1",
             "TimeUtil::DurationToMilliseconds(TimeUtil::MillisecondsToDuration(1))",&local_674,
             &local_680);
  Duration::~Duration(&local_6a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_6b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_6b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_6b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_6cc = -1;
  TimeUtil::MillisecondsToDuration(&local_700,-1);
  local_6d8 = TimeUtil::DurationToMilliseconds(&local_700);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_6c8,"-1",
             "TimeUtil::DurationToMilliseconds( TimeUtil::MillisecondsToDuration(-1))",&local_6cc,
             &local_6d8);
  Duration::~Duration(&local_700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c8);
  if (!bVar1) {
    testing::Message::Message(&local_708);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c8);
  local_728 = 0x11f03c3613000;
  TimeUtil::SecondsToDuration(&local_758,0x4979cb9e00);
  local_730 = TimeUtil::DurationToMilliseconds(&local_758);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_720,"315576000000000",
             "TimeUtil::DurationToMilliseconds( TimeUtil::SecondsToDuration(315576000000))",
             &local_728,&local_730);
  Duration::~Duration(&local_758);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar1) {
    testing::Message::Message(&local_760);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_760);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  local_780 = 0x46126b333a38000;
  TimeUtil::SecondsToDuration(&local_7b0,0x4979cb9e00);
  local_788 = TimeUtil::DurationToMicroseconds(&local_7b0);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_778,"315576000000000000",
             "TimeUtil::DurationToMicroseconds( TimeUtil::SecondsToDuration(315576000000))",
             &local_780,&local_788);
  Duration::~Duration(&local_7b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  local_7d4 = 1;
  TimeUtil::SecondsToDuration(&local_808,1);
  local_7e0 = TimeUtil::DurationToSeconds(&local_808);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_7d0,"1","TimeUtil::DurationToSeconds(TimeUtil::SecondsToDuration(1))"
             ,&local_7d4,&local_7e0);
  Duration::~Duration(&local_808);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar1) {
    testing::Message::Message(&local_810);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_810);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  local_82c = -1;
  TimeUtil::SecondsToDuration(&local_860,-1);
  local_838 = TimeUtil::DurationToSeconds(&local_860);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_828,"-1",
             "TimeUtil::DurationToSeconds(TimeUtil::SecondsToDuration(-1))",&local_82c,&local_838);
  Duration::~Duration(&local_860);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_828);
  if (!bVar1) {
    testing::Message::Message(&local_868);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_828);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_868);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
  local_884 = 1;
  TimeUtil::MinutesToDuration(&local_8b8,1);
  local_890 = TimeUtil::DurationToMinutes(&local_8b8);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_880,"1","TimeUtil::DurationToMinutes(TimeUtil::MinutesToDuration(1))"
             ,&local_884,&local_890);
  Duration::~Duration(&local_8b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_880);
  if (!bVar1) {
    testing::Message::Message(&local_8c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_880);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_8c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_8c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_880);
  local_8dc = -1;
  TimeUtil::MinutesToDuration(&local_910,-1);
  local_8e8 = TimeUtil::DurationToMinutes(&local_910);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_8d8,"-1",
             "TimeUtil::DurationToMinutes(TimeUtil::MinutesToDuration(-1))",&local_8dc,&local_8e8);
  Duration::~Duration(&local_910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
  if (!bVar1) {
    testing::Message::Message(&local_918);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_918);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
  local_934 = 1;
  TimeUtil::HoursToDuration(&local_968,1);
  local_940 = TimeUtil::DurationToHours(&local_968);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_930,"1","TimeUtil::DurationToHours(TimeUtil::HoursToDuration(1))",
             &local_934,&local_940);
  Duration::~Duration(&local_968);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar1) {
    testing::Message::Message(&local_970);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_930);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x9f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_970);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_970);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  local_98c = -1;
  TimeUtil::HoursToDuration(&local_9c0,-1);
  local_998 = TimeUtil::DurationToHours(&local_9c0);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_988,"-1","TimeUtil::DurationToHours(TimeUtil::HoursToDuration(-1))",
             &local_98c,&local_998);
  Duration::~Duration(&local_9c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
  if (!bVar1) {
    testing::Message::Message(&local_9c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_9c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
  local_9e4 = 1;
  TimeUtil::NanosecondsToDuration(&local_a18,1999);
  local_9f0 = TimeUtil::DurationToMicroseconds(&local_a18);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_9e0,"1",
             "TimeUtil::DurationToMicroseconds( TimeUtil::NanosecondsToDuration(1999))",&local_9e4,
             &local_9f0);
  Duration::~Duration(&local_a18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
  if (!bVar1) {
    testing::Message::Message(&local_a20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_a20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
  local_a3c = -1;
  TimeUtil::NanosecondsToDuration(&local_a70,-1999);
  local_a48 = TimeUtil::DurationToMicroseconds(&local_a70);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_a38,"-1",
             "TimeUtil::DurationToMicroseconds( TimeUtil::NanosecondsToDuration(-1999))",&local_a3c,
             &local_a48);
  Duration::~Duration(&local_a70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a38);
  if (!bVar1) {
    testing::Message::Message(&local_a78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a38);
    testing::internal::AssertHelper::AssertHelper
              (&local_a80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xa7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a80,&local_a78);
    testing::internal::AssertHelper::~AssertHelper(&local_a80);
    testing::Message::~Message(&local_a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a38);
  return;
}

Assistant:

TEST(TimeUtilTest, DurationIntegerConversion) {
  EXPECT_EQ("0.000000001s",
            TimeUtil::ToString(TimeUtil::NanosecondsToDuration(1)));
  EXPECT_EQ("-0.000000001s",
            TimeUtil::ToString(TimeUtil::NanosecondsToDuration(-1)));
  EXPECT_EQ("0.000001s",
            TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(1)));
  EXPECT_EQ("-0.000001s",
            TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(-1)));
  EXPECT_EQ("0.001s", TimeUtil::ToString(TimeUtil::MillisecondsToDuration(1)));
  EXPECT_EQ("-0.001s",
            TimeUtil::ToString(TimeUtil::MillisecondsToDuration(-1)));
  EXPECT_EQ("1s", TimeUtil::ToString(TimeUtil::SecondsToDuration(1)));
  EXPECT_EQ("-1s", TimeUtil::ToString(TimeUtil::SecondsToDuration(-1)));
  EXPECT_EQ("60s", TimeUtil::ToString(TimeUtil::MinutesToDuration(1)));
  EXPECT_EQ("-60s", TimeUtil::ToString(TimeUtil::MinutesToDuration(-1)));
  EXPECT_EQ("3600s", TimeUtil::ToString(TimeUtil::HoursToDuration(1)));
  EXPECT_EQ("-3600s", TimeUtil::ToString(TimeUtil::HoursToDuration(-1)));

  EXPECT_EQ(
      1, TimeUtil::DurationToNanoseconds(TimeUtil::NanosecondsToDuration(1)));
  EXPECT_EQ(
      -1, TimeUtil::DurationToNanoseconds(TimeUtil::NanosecondsToDuration(-1)));
  EXPECT_EQ(
      1, TimeUtil::DurationToMicroseconds(TimeUtil::MicrosecondsToDuration(1)));
  EXPECT_EQ(-1, TimeUtil::DurationToMicroseconds(
                    TimeUtil::MicrosecondsToDuration(-1)));
  EXPECT_EQ(
      1, TimeUtil::DurationToMilliseconds(TimeUtil::MillisecondsToDuration(1)));
  EXPECT_EQ(-1, TimeUtil::DurationToMilliseconds(
                    TimeUtil::MillisecondsToDuration(-1)));
  // Test overflow issue
  EXPECT_EQ(315576000000000, TimeUtil::DurationToMilliseconds(
                                 TimeUtil::SecondsToDuration(315576000000)));
  // Test overflow issue
  EXPECT_EQ(315576000000000000, TimeUtil::DurationToMicroseconds(
                                    TimeUtil::SecondsToDuration(315576000000)));
  EXPECT_EQ(1, TimeUtil::DurationToSeconds(TimeUtil::SecondsToDuration(1)));
  EXPECT_EQ(-1, TimeUtil::DurationToSeconds(TimeUtil::SecondsToDuration(-1)));
  EXPECT_EQ(1, TimeUtil::DurationToMinutes(TimeUtil::MinutesToDuration(1)));
  EXPECT_EQ(-1, TimeUtil::DurationToMinutes(TimeUtil::MinutesToDuration(-1)));
  EXPECT_EQ(1, TimeUtil::DurationToHours(TimeUtil::HoursToDuration(1)));
  EXPECT_EQ(-1, TimeUtil::DurationToHours(TimeUtil::HoursToDuration(-1)));

  // Test truncation behavior.
  EXPECT_EQ(1, TimeUtil::DurationToMicroseconds(
                   TimeUtil::NanosecondsToDuration(1999)));
  // For negative values, Duration will be rounded towards 0.
  EXPECT_EQ(-1, TimeUtil::DurationToMicroseconds(
                    TimeUtil::NanosecondsToDuration(-1999)));
}